

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLDST2Instruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined4 local_44;
  uint size;
  uint load;
  uint align;
  uint type;
  void *Decoder_local;
  uint64_t Address_local;
  uint Insn_local;
  MCInst *Inst_local;
  
  uVar1 = fieldFromInstruction_4(Insn,6,2);
  if (uVar1 == 3) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    uVar1 = fieldFromInstruction_4(Insn,8,4);
    uVar2 = fieldFromInstruction_4(Insn,4,2);
    if ((uVar1 == 8) && (uVar2 == 3)) {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
    else if ((uVar1 == 9) && (uVar2 == 3)) {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
    else {
      uVar1 = fieldFromInstruction_4(Insn,0x15,1);
      if (uVar1 == 0) {
        local_44 = DecodeVSTInstruction(Inst,Insn,Address,Decoder);
      }
      else {
        local_44 = DecodeVLDInstruction(Inst,Insn,Address,Decoder);
      }
      Inst_local._4_4_ = local_44;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeVLDST2Instruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	unsigned type, align, load;
	unsigned size = fieldFromInstruction_4(Insn, 6, 2);
	if (size == 3) return MCDisassembler_Fail;

	type = fieldFromInstruction_4(Insn, 8, 4);
	align = fieldFromInstruction_4(Insn, 4, 2);
	if (type == 8 && align == 3) return MCDisassembler_Fail;
	if (type == 9 && align == 3) return MCDisassembler_Fail;

	load = fieldFromInstruction_4(Insn, 21, 1);
	return load ? DecodeVLDInstruction(Inst, Insn, Address, Decoder)
		: DecodeVSTInstruction(Inst, Insn, Address, Decoder);
}